

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationDataBuilder::getCE32FromOffsetCE32
          (CollationDataBuilder *this,UBool fromBase,UChar32 c,uint32_t ce32)

{
  int32_t index;
  uint32_t uVar1;
  int64_t local_40;
  uint32_t p;
  int64_t dataCE;
  int32_t i;
  uint32_t ce32_local;
  UChar32 c_local;
  UBool fromBase_local;
  CollationDataBuilder *this_local;
  
  index = Collation::indexFromCE32(ce32);
  if (fromBase == '\0') {
    local_40 = UVector64::elementAti(&this->ce64s,index);
  }
  else {
    local_40 = this->base->ces[index];
  }
  uVar1 = Collation::getThreeBytePrimaryForOffsetData(c,local_40);
  uVar1 = Collation::makeLongPrimaryCE32(uVar1);
  return uVar1;
}

Assistant:

uint32_t
CollationDataBuilder::getCE32FromOffsetCE32(UBool fromBase, UChar32 c, uint32_t ce32) const {
    int32_t i = Collation::indexFromCE32(ce32);
    int64_t dataCE = fromBase ? base->ces[i] : ce64s.elementAti(i);
    uint32_t p = Collation::getThreeBytePrimaryForOffsetData(c, dataCE);
    return Collation::makeLongPrimaryCE32(p);
}